

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::getTessellationEvaluationShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest13 *this,uint n_id)

{
  ostream *poVar1;
  stringstream result_sstream;
  stringstream local_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(&local_188,
                           "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(quads, point_mode) in;\nsubroutine void SubroutineTEType(inout vec4 result);\n\nsubroutine(SubroutineTEType) void SubroutineTE1(inout vec4 result)\n{\n    result += vec4(0, 0, "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 1) * 0.325);
  poVar1 = std::operator<<(poVar1,
                           ", 0);\n}\nsubroutine(SubroutineTEType) void SubroutineTE2(inout vec4 result)\n{\n    result += vec4(0, 0, "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 1) * 0.0325);
  std::operator<<(poVar1,
                  ", 0);\n}\n\nsubroutine uniform SubroutineTEType function;\n\nin TC_DATA\n{\n    vec4 data;\n} in_tc[];\n\nout TE_DATA\n{\n    vec4 data;\n} out_te;\n\nin gl_PerVertex { vec4 gl_Position; } gl_in[];\nout gl_PerVertex { vec4 gl_Position; };\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n    out_te.data = in_tc[0].data;\n\n    function(out_te.data);\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest13::getTessellationEvaluationShaderBody(unsigned int n_id)
{
	std::stringstream result_sstream;

	/* Pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  "layout(quads, point_mode) in;\n"
					  /* Sub-routine */
					  "subroutine void SubroutineTEType(inout vec4 result);\n"
					  "\n"
					  "subroutine(SubroutineTEType) void SubroutineTE1(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4(0, 0, "
				   << float(n_id + 1) * 0.325f << ", 0);\n"
												  "}\n"
												  "subroutine(SubroutineTEType) void SubroutineTE2(inout vec4 result)\n"
												  "{\n"
												  "    result += vec4(0, 0, "
				   << float(n_id + 1) * 0.0325f << ", 0);\n"
												   "}\n"
												   "\n"
												   "subroutine uniform SubroutineTEType function;\n"
												   "\n"
												   /* Input block */
												   "in TC_DATA\n"
												   "{\n"
												   "    vec4 data;\n"
												   "} in_tc[];\n"
												   "\n"
												   /* Output block */
												   "out TE_DATA\n"
												   "{\n"
												   "    vec4 data;\n"
												   "} out_te;\n"
												   "\n"
												   "in gl_PerVertex { vec4 gl_Position; } gl_in[];\n"
												   "out gl_PerVertex { vec4 gl_Position; };\n"
												   /* main() declaration */
												   "void main()\n"
												   "{\n"
												   "    gl_Position = gl_in[0].gl_Position;\n"
												   "    out_te.data = in_tc[0].data;\n"
												   "\n"
												   "    function(out_te.data);\n"
												   "}\n";

	return result_sstream.str();
}